

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexec.c
# Opt level: O3

int regexec(regex_t *__preg,char *__string,size_t __nmatch,regmatch_t *__pmatch,int __eflags)

{
  undefined8 *puVar1;
  char cVar2;
  re_guts *prVar3;
  sopno sVar4;
  long lVar5;
  undefined8 uVar6;
  size_t sVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  regmatch_t rVar13;
  char *pcVar14;
  ushort **ppuVar15;
  char *pcVar16;
  size_t sVar17;
  ushort *puVar18;
  ushort uVar19;
  char *pcVar20;
  regoff_t *prVar21;
  ulong uVar22;
  undefined8 *puVar23;
  regmatch_t *__ptr;
  uint ch;
  char *pcVar24;
  char *pcVar25;
  long lVar26;
  re_guts *m;
  regmatch_t *__ptr_00;
  int iVar27;
  uint uVar28;
  int iVar29;
  char **ppcVar30;
  lmat local_c8;
  char **local_58;
  size_t local_50;
  regmatch_t *local_48;
  char *local_40;
  uint local_34;
  
  if (*(int *)&__preg->buffer != 0xf265) {
    return 2;
  }
  prVar3 = (re_guts *)__preg->syntax;
  if (prVar3->magic != 0xd245) {
    return 2;
  }
  local_48 = __pmatch;
  if (((ulong)*(char **)&prVar3->iflags & 4) != 0) {
    __assert_fail("!(g->iflags&BAD)",
                  "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/regexec.c"
                  ,0x79,"int regexec()");
  }
  pcVar20 = (char *)prVar3->nstates;
  local_c8.g = prVar3;
  local_c8.eflags = __eflags;
  local_c8.offp = __string;
  if (((uint)__eflags >> 9 & 1) != 0 || (char *)0x20 < pcVar20) {
    ppcVar30 = (char **)prVar3->firststate;
    sVar4 = prVar3->laststate;
    local_50 = 0;
    if (((ulong)*(char **)&prVar3->cflags & 4) == 0) {
      local_50 = __nmatch;
    }
    if ((__eflags & 4U) == 0) {
      rVar13 = (regmatch_t)strlen(__string);
      pcVar14 = __string;
    }
    else {
      pcVar14 = __string + (long)*__pmatch;
      rVar13 = __pmatch[1];
    }
    pcVar16 = __string + (long)rVar13;
    lVar26 = (long)pcVar16 - (long)pcVar14;
    if (pcVar16 < pcVar14) {
      return 0x10;
    }
    pcVar24 = prVar3->must;
    if (pcVar24 != (char *)0x0) {
      pcVar25 = pcVar14;
      if (pcVar14 < pcVar16) {
        cVar2 = *pcVar24;
        do {
          if (((*pcVar25 == cVar2) && (prVar3->mlen <= lVar26)) &&
             (iVar8 = bcmp(pcVar25,pcVar24,(long)prVar3->mlen), iVar8 == 0)) break;
          pcVar25 = pcVar25 + 1;
          lVar26 = lVar26 + -1;
        } while (pcVar25 < pcVar16);
      }
      if (pcVar25 == pcVar16) {
        return 1;
      }
    }
    local_c8.pmatch = (regmatch_t *)0x0;
    local_c8.lastpos = (char **)0x0;
    local_c8.beginp = pcVar14;
    local_c8.endp = pcVar16;
    local_c8.space = (char *)malloc((long)pcVar20 * 4);
    if ((regmatch_t *)local_c8.space == (regmatch_t *)0x0) {
      return 0xc;
    }
    lVar26 = (long)ppcVar30 + 1;
    local_c8.st._0_4_ = (int)local_c8.space;
    local_c8.st._4_4_ = (undefined4)((ulong)local_c8.space >> 0x20);
    local_c8.fresh = pcVar20 + (long)&((regmatch_t *)local_c8.space)->rm_so;
    local_c8.tmp = (char *)((long)&((regmatch_t *)local_c8.space)->rm_so + (long)pcVar20 * 2);
    local_c8.vn = 4;
    local_c8.empty = (char *)((long)&((regmatch_t *)local_c8.space)->rm_so + (long)pcVar20 * 3);
    memset(local_c8.empty,0,(size_t)pcVar20);
LAB_001065d9:
    pcVar24 = local_c8.tmp;
    pcVar20 = local_c8.fresh;
    iVar8 = (int)local_c8.st;
    if (local_c8.beginp == pcVar14) {
      uVar9 = 0x80;
    }
    else {
      uVar9 = (uint)pcVar14[-1];
    }
    pcVar25 = (char *)CONCAT44(local_c8.st._4_4_,(int)local_c8.st);
    memset(pcVar25,0,(size_t)(local_c8.g)->nstates);
    pcVar25[lVar26] = '\x01';
    lstep(local_c8.g,lVar26,sVar4,pcVar25,0x84,pcVar25);
    local_58 = (char **)pcVar20;
    memcpy(pcVar20,pcVar25,(local_c8.g)->nstates);
    lprint((lmat *)local_c8.g,(char *)(ulong)(uint)local_c8.eflags,"start",iVar8,
           (FILE *)(ulong)(uint)(int)*pcVar14);
    pcVar20 = (char *)0x0;
    do {
      m = local_c8.g;
      if (pcVar14 == local_c8.endp) {
        uVar11 = 0x80;
      }
      else {
        uVar11 = (uint)*pcVar14;
      }
      iVar12 = bcmp(pcVar25,local_58,(size_t)(local_c8.g)->nstates);
      local_40 = pcVar20;
      if (iVar12 == 0) {
        local_40 = pcVar14;
      }
      iVar12 = 0;
      iVar27 = 0x82;
      if (uVar9 == 0x80) {
        iVar29 = 0;
        if ((local_c8.eflags & 1U) == 0) {
LAB_00106710:
          iVar29 = m->nbol;
          iVar12 = 0x81;
          iVar27 = 0x83;
        }
      }
      else if (uVar9 == 10) {
        iVar29 = 0;
        if (((ulong)*(char **)&m->cflags & 8) != 0) goto LAB_00106710;
      }
      else {
        iVar29 = 0;
      }
      if (uVar11 == 0x80) {
        if ((local_c8.eflags & 2U) == 0) goto LAB_00106744;
      }
      else if ((uVar11 == 10) && (((ulong)*(char **)&m->cflags & 8) != 0)) {
LAB_00106744:
        iVar29 = iVar29 + m->neol;
        iVar12 = iVar27;
      }
      if (iVar29 != 0) {
        if (0 < iVar29) {
          uVar10 = iVar29 + 1;
          do {
            lstep(local_c8.g,lVar26,sVar4,pcVar25,iVar12,pcVar25);
            uVar10 = uVar10 - 1;
            m = local_c8.g;
          } while (1 < uVar10);
        }
        lprint((lmat *)m,(char *)(ulong)(uint)local_c8.eflags,"boleol",iVar8,(FILE *)(ulong)uVar11);
      }
      if (iVar12 == 0x81) {
        iVar27 = 0x81;
        if (uVar11 != 0x80) {
          ppuVar15 = __ctype_b_loc();
          puVar18 = *ppuVar15;
LAB_00106828:
          if (uVar11 == 0x5f) {
            iVar12 = 0x85;
          }
          iVar27 = iVar12;
          if ((puVar18[(int)uVar11] & 8) != 0) {
            iVar27 = 0x85;
          }
        }
        iVar12 = iVar27;
        if (uVar9 == 0x80) goto LAB_0010687a;
        ppuVar15 = __ctype_b_loc();
        puVar18 = *ppuVar15;
        uVar19 = puVar18[(int)uVar9] & 8;
LAB_00106870:
        if (((uVar19 == 0) && (uVar9 != 0x5f)) ||
           ((iVar27 = 0x86, iVar12 != 0x82 &&
            (((uVar11 == 0x80 || ((puVar18[(int)uVar11] & 8) != 0)) || (uVar11 == 0x5f))))))
        goto LAB_0010687a;
LAB_0010689e:
        lstep(local_c8.g,lVar26,sVar4,pcVar25,iVar27,pcVar25);
        lprint((lmat *)local_c8.g,(char *)(ulong)(uint)local_c8.eflags,"boweow",iVar8,
               (FILE *)(ulong)uVar11);
      }
      else {
        if (uVar9 != 0x80) {
          ppuVar15 = __ctype_b_loc();
          puVar18 = *ppuVar15;
          uVar19 = puVar18[(int)uVar9] & 8;
          if (((uVar19 == 0) && (uVar9 != 0x5f)) && (uVar11 != 0x80)) goto LAB_00106828;
          goto LAB_00106870;
        }
LAB_0010687a:
        iVar27 = iVar12;
        if (iVar12 - 0x85U < 2) goto LAB_0010689e;
      }
      sVar7 = local_50;
      if ((pcVar14 == pcVar16) || (pcVar25[sVar4] != '\0')) goto LAB_001069e1;
      memcpy(pcVar24,pcVar25,(size_t)(local_c8.g)->nstates);
      memcpy(pcVar25,local_58,(size_t)(local_c8.g)->nstates);
      if (uVar11 == 0x80) {
        pcVar20 = "char *lfast()";
        goto LAB_00106f85;
      }
      lstep(local_c8.g,lVar26,sVar4,pcVar24,uVar11,pcVar25);
      lprint((lmat *)local_c8.g,(char *)(ulong)(uint)local_c8.eflags,"aft",iVar8,
             (FILE *)(ulong)uVar11);
      lstep(local_c8.g,lVar26,sVar4,pcVar25,0x84,pcVar25);
      pcVar14 = pcVar14 + 1;
      pcVar20 = local_40;
      uVar9 = uVar11;
    } while( true );
  }
  local_58 = (char **)prVar3->firststate;
  sVar4 = prVar3->laststate;
  local_50 = 0;
  if (((ulong)*(char **)&prVar3->cflags & 4) == 0) {
    local_50 = __nmatch;
  }
  if ((__eflags & 4U) == 0) {
    rVar13 = (regmatch_t)strlen(__string);
    pcVar20 = __string;
  }
  else {
    pcVar20 = __string + (long)*__pmatch;
    rVar13 = __pmatch[1];
  }
  pcVar14 = __string + (long)rVar13;
  lVar26 = (long)pcVar14 - (long)pcVar20;
  if (pcVar14 < pcVar20) {
    return 0x10;
  }
  pcVar16 = prVar3->must;
  if (pcVar16 != (char *)0x0) {
    pcVar24 = pcVar20;
    if (pcVar20 < pcVar14) {
      cVar2 = *pcVar16;
      do {
        if ((*pcVar24 == cVar2) && (prVar3->mlen <= lVar26)) {
          iVar8 = bcmp(pcVar24,pcVar16,(long)prVar3->mlen);
          if (iVar8 == 0) break;
        }
        pcVar24 = pcVar24 + 1;
        lVar26 = lVar26 + -1;
      } while (pcVar24 < pcVar14);
    }
    if (pcVar24 == pcVar14) {
      return 1;
    }
  }
  ppcVar30 = (char **)((long)local_58 + 1);
  local_c8.pmatch = (regmatch_t *)0x0;
  local_c8.lastpos = (char **)0x0;
  local_34 = 1 << ((byte)ppcVar30 & 0x1f);
  local_40 = (char *)CONCAT44(local_40._4_4_,1 << ((byte)sVar4 & 0x1f));
  local_c8._68_4_ = 0;
  local_c8.space = (char *)0x0;
  local_c8.st._0_4_ = 0;
  local_c8.beginp = pcVar20;
  local_c8.endp = pcVar14;
  local_58 = ppcVar30;
LAB_00105e10:
  if (local_c8.beginp == pcVar20) {
    uVar9 = 0x80;
  }
  else {
    uVar9 = (uint)pcVar20[-1];
  }
  uVar10 = sstep(local_c8.g,(sopno)ppcVar30,sVar4,local_34,0x84,local_34);
  sprint((smat *)local_c8.g,(char *)(ulong)(uint)local_c8.eflags,0x10c704,uVar10,
         (FILE *)(ulong)(uint)(int)*pcVar20);
  pcVar16 = (char *)0x0;
  uVar11 = uVar10;
  do {
    ppcVar30 = local_58;
    if (pcVar20 == local_c8.endp) {
      ch = 0x80;
    }
    else {
      ch = (uint)*pcVar20;
    }
    if (uVar11 == uVar10) {
      pcVar16 = pcVar20;
    }
    iVar8 = 0;
    iVar12 = 0x82;
    if (uVar9 == 0x80) {
      iVar27 = 0;
      iVar8 = 0;
      if ((local_c8.eflags & 1U) == 0) {
LAB_00105ed9:
        iVar27 = (local_c8.g)->nbol;
        iVar12 = 0x83;
        iVar8 = 0x81;
      }
    }
    else if (uVar9 == 10) {
      iVar27 = 0;
      if (((local_c8.g)->cflags & 8) != 0) goto LAB_00105ed9;
    }
    else {
      iVar27 = 0;
      iVar8 = 0;
    }
    if (ch == 0x80) {
      if ((local_c8.eflags & 2U) == 0) goto LAB_00105f15;
    }
    else if ((ch == 10) && (((local_c8.g)->cflags & 8) != 0)) {
LAB_00105f15:
      iVar27 = iVar27 + (local_c8.g)->neol;
      iVar8 = iVar12;
    }
    if (iVar27 != 0) {
      if (0 < iVar27) {
        uVar28 = iVar27 + 1;
        do {
          uVar11 = sstep(local_c8.g,(sopno)ppcVar30,sVar4,uVar11,iVar8,uVar11);
          uVar28 = uVar28 - 1;
        } while (1 < uVar28);
      }
      sprint((smat *)local_c8.g,(char *)(ulong)(uint)local_c8.eflags,0x10cfda,uVar11,
             (FILE *)(ulong)ch);
    }
    if (iVar8 == 0x81) {
      iVar12 = 0x81;
      if (ch != 0x80) {
        ppuVar15 = __ctype_b_loc();
        puVar18 = *ppuVar15;
LAB_00105fe3:
        if (ch == 0x5f) {
          iVar8 = 0x85;
        }
        iVar12 = iVar8;
        if ((puVar18[(int)ch] & 8) != 0) {
          iVar12 = 0x85;
        }
      }
      iVar8 = iVar12;
      if (uVar9 == 0x80) goto LAB_00106037;
      ppuVar15 = __ctype_b_loc();
      puVar18 = *ppuVar15;
      uVar19 = puVar18[(int)uVar9] & 8;
LAB_00106028:
      if (((uVar19 == 0) && (uVar9 != 0x5f)) ||
         ((iVar12 = 0x86, iVar8 != 0x82 &&
          (((ch == 0x80 || ((puVar18[(int)ch] & 8) != 0)) || (ch == 0x5f)))))) goto LAB_00106037;
LAB_00106063:
      ppcVar30 = local_58;
      uVar11 = sstep(local_c8.g,(sopno)local_58,sVar4,uVar11,iVar12,uVar11);
      sprint((smat *)local_c8.g,(char *)(ulong)(uint)local_c8.eflags,0x10cfe2,uVar11,
             (FILE *)(ulong)ch);
    }
    else {
      if (uVar9 != 0x80) {
        ppuVar15 = __ctype_b_loc();
        puVar18 = *ppuVar15;
        uVar19 = puVar18[(int)uVar9] & 8;
        if (((uVar19 == 0) && (uVar9 != 0x5f)) && (ch != 0x80)) goto LAB_00105fe3;
        goto LAB_00106028;
      }
LAB_00106037:
      ppcVar30 = local_58;
      iVar12 = iVar8;
      if (iVar8 - 0x85U < 2) goto LAB_00106063;
    }
    if ((pcVar20 == pcVar14) || ((uVar11 & (uint)local_40) != 0)) goto LAB_00106160;
    if (ch == 0x80) {
      pcVar20 = "char *sfast()";
LAB_00106f85:
      __assert_fail("c != OUT",
                    "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/engine.c"
                    ,0x2c9,pcVar20);
    }
    uVar11 = sstep(local_c8.g,(sopno)ppcVar30,sVar4,uVar11,ch,uVar10);
    sprint((smat *)local_c8.g,(char *)(ulong)(uint)local_c8.eflags,0x10cff8,uVar11,(FILE *)(ulong)ch
          );
    uVar28 = sstep(local_c8.g,(sopno)ppcVar30,sVar4,uVar11,0x84,uVar11);
    pcVar20 = pcVar20 + 1;
    uVar9 = ch;
    if (uVar28 != uVar11) {
      __assert_fail("EQ(step(m->g, startst, stopst, st, NOTHING, st), st)",
                    "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/engine.c"
                    ,0x2cc,"char *sfast()");
    }
  } while( true );
LAB_001069e1:
  if (local_40 == (char *)0x0) {
    pcVar20 = "char *lfast()";
    goto LAB_00107027;
  }
  local_c8.coldp = local_40;
  if (pcVar25[sVar4] == '\0') {
    iVar8 = 1;
    __ptr = (regmatch_t *)local_c8.space;
    goto LAB_00106e95;
  }
  if ((local_50 == 0) && (prVar3->backrefs == 0)) goto LAB_00106e59;
  while( true ) {
    if ((local_c8.eflags & 0x100U) != 0) {
      printf("=%s\n","finding start");
    }
    pcVar20 = lslow(&local_c8,local_c8.coldp,pcVar16,lVar26,sVar4);
    if (pcVar20 != (char *)0x0) break;
    if (local_c8.endp <= local_c8.coldp) {
      pcVar20 = "int lmatcher()";
      goto LAB_00106fa4;
    }
    local_c8.coldp = local_c8.coldp + 1;
  }
  if ((sVar7 != 1) || (prVar3->backrefs != 0)) {
    sVar17 = (local_c8.g)->nsub;
    if ((local_c8.pmatch == (regmatch_t *)0x0) &&
       (local_c8.pmatch = (regmatch_t *)malloc(sVar17 * 0x10 + 0x10),
       local_c8.pmatch == (regmatch_t *)0x0)) {
      iVar8 = 0xc;
      __ptr = (regmatch_t *)local_c8.space;
      goto LAB_00106e95;
    }
    __ptr_00 = local_c8.pmatch;
    if (sVar17 != 0) {
      memset(local_c8.pmatch + 1,0xff,sVar17 << 4);
    }
    if ((prVar3->backrefs == 0) && (((uint)local_c8.eflags >> 10 & 1) == 0)) {
      if (((uint)local_c8.eflags >> 8 & 1) != 0) {
        printf("=%s\n","dissecting");
      }
      pcVar14 = ldissect(&local_c8,local_c8.coldp,pcVar20,lVar26,sVar4);
    }
    else {
      lVar5 = prVar3->nplus;
      if ((regmatch_t *)local_c8.lastpos == (regmatch_t *)0x0 && 0 < lVar5) {
        local_c8.lastpos = (char **)malloc(lVar5 * 8 + 8);
      }
      if (0 < lVar5 && (regmatch_t *)local_c8.lastpos == (regmatch_t *)0x0) {
        iVar8 = 0xc;
        goto LAB_00106e85;
      }
      if ((local_c8.eflags & 0x100U) != 0) {
        printf("=%s\n","backref dissect");
      }
      pcVar14 = lbackref(&local_c8,local_c8.coldp,pcVar20,lVar26,sVar4,0);
    }
    if (pcVar14 == (char *)0x0) {
      if (prVar3->backrefs == 0) {
        pcVar20 = "int lmatcher()";
        goto LAB_00107065;
      }
      if ((prVar3->nplus != 0) && ((regmatch_t *)local_c8.lastpos == (regmatch_t *)0x0)) {
        pcVar20 = "int lmatcher()";
        goto LAB_00107046;
      }
      if (pcVar20 <= local_c8.coldp) {
LAB_00106ccc:
        if ((local_c8.eflags & 0x100U) != 0) {
          printf("=%s\n");
        }
        pcVar14 = local_c8.coldp + 1;
        if (pcVar16 < pcVar14) goto code_r0x00106cfb;
        goto LAB_001065d9;
      }
      do {
        if ((local_c8.eflags & 0x100U) != 0) {
          printf("=%s\n","backoff");
        }
        pcVar20 = lslow(&local_c8,local_c8.coldp,pcVar20 + -1,lVar26,sVar4);
        if (pcVar20 == (char *)0x0) goto LAB_00106ccc;
        sVar17 = (local_c8.g)->nsub;
        if (sVar17 != 0) {
          prVar21 = &local_c8.pmatch[1].rm_eo;
          do {
            if (((regmatch_t *)(prVar21 + -1))->rm_so != -1) {
              pcVar20 = "int lmatcher()";
              goto LAB_00106efa;
            }
            if (*prVar21 != -1) {
              pcVar20 = "int lmatcher()";
              goto LAB_00106f19;
            }
            prVar21 = prVar21 + 2;
            sVar17 = sVar17 - 1;
          } while (sVar17 != 0);
        }
        if ((local_c8.eflags & 0x100U) != 0) {
          printf("=%s\n","backoff dissect");
        }
        pcVar14 = lbackref(&local_c8,local_c8.coldp,pcVar20,lVar26,sVar4,0);
      } while ((pcVar14 == (char *)0x0) && (local_c8.coldp < pcVar20));
      if (pcVar14 != pcVar20 && pcVar14 != (char *)0x0) {
        pcVar20 = "int lmatcher()";
        goto LAB_0010709b;
      }
      if (pcVar14 == (char *)0x0) goto LAB_00106ccc;
    }
    if (sVar7 == 0) goto LAB_00106e59;
  }
  *local_48 = (regmatch_t)((long)local_c8.coldp - (long)local_c8.offp);
  local_48[1] = (regmatch_t)((long)pcVar20 - (long)local_c8.offp);
  if (sVar7 < 2) goto LAB_00106e59;
  if (local_c8.pmatch == (regmatch_t *)0x0) {
    pcVar20 = "int lmatcher()";
    goto LAB_001070d1;
  }
  uVar22 = 1;
  lVar26 = 0x10;
  do {
    puVar23 = (undefined8 *)((long)&local_48->rm_so + lVar26);
    if ((local_c8.g)->nsub < uVar22) {
      *(undefined4 *)puVar23 = 0xffffffff;
      *(undefined4 *)((long)puVar23 + 4) = 0xffffffff;
      *(undefined4 *)(puVar23 + 1) = 0xffffffff;
      *(undefined4 *)((long)puVar23 + 0xc) = 0xffffffff;
    }
    else {
      puVar1 = (undefined8 *)((long)&(local_c8.pmatch)->rm_so + lVar26);
      uVar6 = puVar1[1];
      *puVar23 = *puVar1;
      puVar23[1] = uVar6;
    }
    uVar22 = uVar22 + 1;
    lVar26 = lVar26 + 0x10;
  } while (sVar7 != uVar22);
LAB_00106e59:
  if (local_c8.pmatch != (regmatch_t *)0x0) {
    free(local_c8.pmatch);
  }
  iVar8 = 0;
  __ptr = (regmatch_t *)local_c8.space;
  __ptr_00 = (regmatch_t *)local_c8.lastpos;
  if ((regmatch_t *)local_c8.lastpos != (regmatch_t *)0x0) {
LAB_00106e85:
    free(__ptr_00);
    __ptr = (regmatch_t *)local_c8.space;
  }
  goto LAB_00106e95;
code_r0x00106cfb:
  pcVar20 = "int lmatcher()";
  goto LAB_00106d10;
code_r0x00106484:
  pcVar20 = "int smatcher()";
LAB_00106d10:
  __assert_fail("start <= stop",
                "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/engine.c"
                ,0xdf,pcVar20);
LAB_00106160:
  if (pcVar16 == (char *)0x0) {
    pcVar20 = "char *sfast()";
LAB_00107027:
    __assert_fail("coldp != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/engine.c"
                  ,0x2d0,pcVar20);
  }
  if (((uint)local_40 & uVar11) == 0) {
    return 1;
  }
  local_c8.coldp = pcVar16;
  if ((local_50 == 0) && (prVar3->backrefs == 0)) goto LAB_00106db5;
  while( true ) {
    if ((local_c8.eflags & 0x100U) != 0) {
      printf("=%s\n","finding start");
    }
    pcVar20 = sslow((smat *)&local_c8,local_c8.coldp,pcVar14,(sopno)ppcVar30,sVar4);
    if (pcVar20 != (char *)0x0) break;
    if (local_c8.endp <= local_c8.coldp) {
      pcVar20 = "int smatcher()";
LAB_00106fa4:
      __assert_fail("m->coldp < m->endp",
                    "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/engine.c"
                    ,0xa2,pcVar20);
    }
    local_c8.coldp = local_c8.coldp + 1;
  }
  if ((local_50 != 1) || (prVar3->backrefs != 0)) {
    sVar17 = (local_c8.g)->nsub;
    if ((local_c8.pmatch == (regmatch_t *)0x0) &&
       (local_c8.pmatch = (regmatch_t *)malloc(sVar17 * 0x10 + 0x10),
       local_c8.pmatch == (regmatch_t *)0x0)) {
      return 0xc;
    }
    __ptr = local_c8.pmatch;
    if (sVar17 != 0) {
      memset(local_c8.pmatch + 1,0xff,sVar17 << 4);
    }
    if ((prVar3->backrefs == 0) && (((uint)local_c8.eflags >> 10 & 1) == 0)) {
      if (((uint)local_c8.eflags >> 8 & 1) != 0) {
        printf("=%s\n","dissecting");
      }
      pcVar16 = sdissect((smat *)&local_c8,local_c8.coldp,pcVar20,(sopno)ppcVar30,sVar4);
    }
    else {
      lVar26 = prVar3->nplus;
      if ((regmatch_t *)local_c8.lastpos == (regmatch_t *)0x0 && 0 < lVar26) {
        local_c8.lastpos = (char **)malloc(lVar26 * 8 + 8);
      }
      if (0 < lVar26 && (regmatch_t *)local_c8.lastpos == (regmatch_t *)0x0) {
        iVar8 = 0xc;
        goto LAB_00106e95;
      }
      if ((local_c8.eflags & 0x100U) != 0) {
        printf("=%s\n","backref dissect");
      }
      pcVar16 = sbackref((smat *)&local_c8,local_c8.coldp,pcVar20,(sopno)ppcVar30,sVar4,0);
    }
    if (pcVar16 == (char *)0x0) {
      if (prVar3->backrefs == 0) {
        pcVar20 = "int smatcher()";
LAB_00107065:
        __assert_fail("g->backrefs",
                      "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/engine.c"
                      ,0xc5,pcVar20);
      }
      if ((prVar3->nplus != 0) && ((regmatch_t *)local_c8.lastpos == (regmatch_t *)0x0)) {
        pcVar20 = "int smatcher()";
LAB_00107046:
        __assert_fail("g->nplus == 0 || m->lastpos != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/engine.c"
                      ,0xc6,pcVar20);
      }
      if (pcVar20 <= local_c8.coldp) {
LAB_00106450:
        if ((local_c8.eflags & 0x100U) != 0) {
          printf("=%s\n","false alarm");
        }
        pcVar20 = local_c8.coldp + 1;
        if (pcVar14 < pcVar20) goto code_r0x00106484;
        goto LAB_00105e10;
      }
      do {
        if ((local_c8.eflags & 0x100U) != 0) {
          printf("=%s\n","backoff");
        }
        pcVar20 = sslow((smat *)&local_c8,local_c8.coldp,pcVar20 + -1,(sopno)ppcVar30,sVar4);
        if (pcVar20 == (char *)0x0) goto LAB_00106450;
        sVar17 = (local_c8.g)->nsub;
        if (sVar17 != 0) {
          prVar21 = &local_c8.pmatch[1].rm_eo;
          do {
            if (((regmatch_t *)(prVar21 + -1))->rm_so != -1) {
              pcVar20 = "int smatcher()";
LAB_00106efa:
              __assert_fail("m->pmatch[i].rm_so == -1",
                            "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/engine.c"
                            ,0xd1,pcVar20);
            }
            if (*prVar21 != -1) {
              pcVar20 = "int smatcher()";
LAB_00106f19:
              __assert_fail("m->pmatch[i].rm_eo == -1",
                            "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/engine.c"
                            ,0xd2,pcVar20);
            }
            prVar21 = prVar21 + 2;
            sVar17 = sVar17 - 1;
          } while (sVar17 != 0);
        }
        if ((local_c8.eflags & 0x100U) != 0) {
          printf("=%s\n","backoff dissect");
        }
        pcVar16 = sbackref((smat *)&local_c8,local_c8.coldp,pcVar20,(sopno)ppcVar30,sVar4,0);
      } while ((pcVar16 == (char *)0x0) && (local_c8.coldp < pcVar20));
      if (pcVar16 != pcVar20 && pcVar16 != (char *)0x0) {
        pcVar20 = "int smatcher()";
LAB_0010709b:
        __assert_fail("dp == NULL || dp == endp",
                      "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/engine.c"
                      ,0xd8,pcVar20);
      }
      if (pcVar16 == (char *)0x0) goto LAB_00106450;
    }
    if (local_50 == 0) goto LAB_00106db5;
  }
  *local_48 = (regmatch_t)((long)local_c8.coldp - (long)local_c8.offp);
  local_48[1] = (regmatch_t)((long)pcVar20 - (long)local_c8.offp);
  if (1 < local_50) {
    if (local_c8.pmatch == (regmatch_t *)0x0) {
      pcVar20 = "int smatcher()";
LAB_001070d1:
      __assert_fail("m->pmatch != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/engine.c"
                    ,0xe8,pcVar20);
    }
    uVar22 = 1;
    lVar26 = 0x10;
    do {
      puVar23 = (undefined8 *)((long)&local_48->rm_so + lVar26);
      if ((local_c8.g)->nsub < uVar22) {
        *(undefined4 *)puVar23 = 0xffffffff;
        *(undefined4 *)((long)puVar23 + 4) = 0xffffffff;
        *(undefined4 *)(puVar23 + 1) = 0xffffffff;
        *(undefined4 *)((long)puVar23 + 0xc) = 0xffffffff;
      }
      else {
        puVar1 = (undefined8 *)((long)&(local_c8.pmatch)->rm_so + lVar26);
        uVar6 = puVar1[1];
        *puVar23 = *puVar1;
        puVar23[1] = uVar6;
      }
      uVar22 = uVar22 + 1;
      lVar26 = lVar26 + 0x10;
    } while (local_50 != uVar22);
  }
LAB_00106db5:
  if (local_c8.pmatch != (regmatch_t *)0x0) {
    free(local_c8.pmatch);
  }
  iVar8 = 0;
  __ptr = (regmatch_t *)local_c8.lastpos;
  if ((regmatch_t *)local_c8.lastpos == (regmatch_t *)0x0) {
    return 0;
  }
LAB_00106e95:
  free(__ptr);
  return iVar8;
}

Assistant:

int				/* 0 success, REG_NOMATCH failure */
regexec(preg, string, nmatch, pmatch, eflags)
const regex_t *preg;
const char *string;
size_t nmatch;
regmatch_t pmatch[];
int eflags;
{
	struct re_guts *g = preg->re_g;
#ifdef REDEBUG
#	define	GOODFLAGS(f)	(f)
#else
#	define	GOODFLAGS(f)	((f)&(REG_NOTBOL|REG_NOTEOL|REG_STARTEND))
#endif

	if (preg->re_magic != MAGIC1 || g->magic != MAGIC2)
		return(REG_BADPAT);
	assert(!(g->iflags&BAD));
	if (g->iflags&BAD)		/* backstop for no-debug case */
		return(REG_BADPAT);
	eflags = GOODFLAGS(eflags);

	if ((size_t) g->nstates <= CHAR_BIT*sizeof(states1) && !(eflags&REG_LARGE))
		return(smatcher(g, (char *)string, nmatch, pmatch, eflags));
	else
		return(lmatcher(g, (char *)string, nmatch, pmatch, eflags));
}